

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_unix.cpp
# Opt level: O2

QNetworkInterface __thiscall
QNativeSocketEnginePrivate::nativeMulticastInterface(QNativeSocketEnginePrivate *this)

{
  long lVar1;
  undefined1 *puVar2;
  bool bVar3;
  int iVar4;
  int i;
  undefined1 *puVar5;
  long in_RSI;
  QNetworkInterface *this_00;
  undefined1 *puVar6;
  long in_FS_OFFSET;
  QNetworkAddressEntry local_90;
  socklen_t sizeofv_1;
  undefined4 uStack_84;
  QNetworkAddressEntry *pQStack_80;
  undefined1 *local_78;
  uint v_1;
  undefined4 uStack_64;
  QNetworkInterface *pQStack_60;
  undefined1 *local_58;
  QHostAddress ipv4;
  socklen_t sizeofv;
  in_addr v;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(in_RSI + 0xa0) - 1U < 2) {
    _v_1 = (Data *)CONCAT44(uStack_64,0xaaaaaaaa);
    _sizeofv_1 = (Data *)CONCAT44(uStack_84,4);
    iVar4 = getsockopt(*(int *)(in_RSI + 0xd8),0x29,0x11,&v_1,&sizeofv_1);
    if (iVar4 != -1) {
      QNetworkInterface::interfaceFromIndex((int)this);
      goto LAB_002170de;
    }
  }
  else {
    v.s_addr = 0;
    sizeofv = 4;
    iVar4 = getsockopt(*(int *)(in_RSI + 0xd8),0,0x20,&v,&sizeofv);
    if (((iVar4 != -1) && (v.s_addr != 0)) && (3 < sizeofv)) {
      ipv4.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QHostAddress::QHostAddress
                (&ipv4,v.s_addr >> 0x18 | (v.s_addr & 0xff0000) >> 8 | (v.s_addr & 0xff00) << 8 |
                       v.s_addr << 0x18);
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      _v_1 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      pQStack_60 = (QNetworkInterface *)&DAT_aaaaaaaaaaaaaaaa;
      QNetworkInterface::allInterfaces();
      puVar5 = (undefined1 *)0x0;
      do {
        if (local_58 <= puVar5) {
          bVar3 = false;
          break;
        }
        this_00 = (QNetworkInterface *)(pQStack_60 + (long)puVar5);
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        _sizeofv_1 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        pQStack_80 = (QNetworkAddressEntry *)&DAT_aaaaaaaaaaaaaaaa;
        QNetworkInterface::addressEntries((QList<QNetworkAddressEntry> *)&sizeofv_1,this_00);
        puVar6 = (undefined1 *)0xffffffffffffffff;
        do {
          puVar2 = local_78;
          puVar6 = puVar6 + 1;
          if (local_78 <= puVar6) {
            bVar3 = false;
            goto LAB_0021709c;
          }
          QNetworkAddressEntry::ip(&local_90);
          bVar3 = QHostAddress::operator==((QHostAddress *)&local_90,&ipv4);
          QHostAddress::~QHostAddress((QHostAddress *)&local_90);
        } while (!bVar3);
        QNetworkInterface::QNetworkInterface((QNetworkInterface *)this,(QNetworkInterface *)this_00)
        ;
        bVar3 = true;
LAB_0021709c:
        QArrayDataPointer<QNetworkAddressEntry>::~QArrayDataPointer
                  ((QArrayDataPointer<QNetworkAddressEntry> *)&sizeofv_1);
        puVar5 = puVar5 + 1;
      } while (puVar2 <= puVar6);
      QArrayDataPointer<QNetworkInterface>::~QArrayDataPointer
                ((QArrayDataPointer<QNetworkInterface> *)&v_1);
      QHostAddress::~QHostAddress(&ipv4);
      if (bVar3) goto LAB_002170de;
    }
  }
  QNetworkInterface::QNetworkInterface((QNetworkInterface *)this);
LAB_002170de:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QSharedDataPointer<QNetworkInterfacePrivate>)
         (QSharedDataPointer<QNetworkInterfacePrivate>)this;
}

Assistant:

QNetworkInterface QNativeSocketEnginePrivate::nativeMulticastInterface() const
{
    if (socketProtocol == QAbstractSocket::IPv6Protocol || socketProtocol == QAbstractSocket::AnyIPProtocol) {
        uint v;
        QT_SOCKOPTLEN_T sizeofv = sizeof(v);
        if (::getsockopt(socketDescriptor, IPPROTO_IPV6, IPV6_MULTICAST_IF, &v, &sizeofv) == -1)
            return QNetworkInterface();
        return QNetworkInterface::interfaceFromIndex(v);
    }

#if defined(Q_OS_SOLARIS)
    struct in_addr v = { 0, 0, 0, 0};
#else
    struct in_addr v = { 0 };
#endif
    QT_SOCKOPTLEN_T sizeofv = sizeof(v);
    if (::getsockopt(socketDescriptor, IPPROTO_IP, IP_MULTICAST_IF, &v, &sizeofv) == -1)
        return QNetworkInterface();
    if (v.s_addr != 0 && sizeofv >= QT_SOCKOPTLEN_T(sizeof(v))) {
        QHostAddress ipv4(ntohl(v.s_addr));
        QList<QNetworkInterface> ifaces = QNetworkInterface::allInterfaces();
        for (int i = 0; i < ifaces.size(); ++i) {
            const QNetworkInterface &iface = ifaces.at(i);
            QList<QNetworkAddressEntry> entries = iface.addressEntries();
            for (int j = 0; j < entries.size(); ++j) {
                const QNetworkAddressEntry &entry = entries.at(j);
                if (entry.ip() == ipv4)
                    return iface;
            }
        }
    }
    return QNetworkInterface();
}